

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jit_compiler_x86.cpp
# Opt level: O0

void __thiscall randomx::JitCompilerX86::h_CFROUND(JitCompilerX86 *this,Instruction *instr,int i)

{
  uint32_t uVar1;
  uint uVar2;
  long in_RSI;
  JitCompilerX86 *in_RDI;
  int rotate;
  uint8_t (*in_stack_ffffffffffffffd8) [16];
  
  emit<2ul>(in_RDI,(uint8_t (*) [2])in_stack_ffffffffffffffd8);
  emitByte(in_RDI,*(char *)(in_RSI + 2) + 0xc0);
  uVar1 = Instruction::getImm32((Instruction *)0x15327d);
  uVar2 = 0xd - (uVar1 & 0x3f) & 0x3f;
  if (uVar2 != 0) {
    emit<3ul>(in_RDI,(uint8_t (*) [3])in_stack_ffffffffffffffd8);
    emitByte(in_RDI,(uint8_t)uVar2);
  }
  emit<16ul>(in_RDI,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

void JitCompilerX86::h_CFROUND(Instruction& instr, int i) {
		emit(REX_MOV_RR64);
		emitByte(0xc0 + instr.src);
		int rotate = (13 - (instr.getImm32() & 63)) & 63;
		if (rotate != 0) {
			emit(ROL_RAX);
			emitByte(rotate);
		}
		emit(AND_OR_MOV_LDMXCSR);
	}